

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall
ktx::CommandCreate::processOptions(CommandCreate *this,Options *opts,ParseResult *args)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  OptionValue *this_00;
  size_t sVar5;
  char (*in_RDI) [86];
  bool canCompare;
  bool astcCodec;
  bool basisCodec;
  char *astcOption;
  char **__end2;
  char **__begin2;
  char *(*__range2) [2];
  uint *in_stack_fffffffffffffea0;
  Reporter *in_stack_fffffffffffffea8;
  ParseResult *in_stack_fffffffffffffeb0;
  Options *in_stack_fffffffffffffeb8;
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  ParseResult *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  Reporter *in_stack_ffffffffffffff08;
  Reporter *in_stack_ffffffffffffff18;
  VkFormat in_stack_ffffffffffffff24;
  string local_c8 [37];
  byte local_a3;
  undefined1 local_a2;
  byte local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  CommandCreate *in_stack_ffffffffffffff98;
  char **local_38;
  
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  ::process(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
            in_stack_fffffffffffffea8);
  uVar3 = std::optional<unsigned_int>::value_or<int>
                    ((optional<unsigned_int> *)in_stack_fffffffffffffea8,
                     (int *)in_stack_fffffffffffffea0);
  *(uint *)((long)(in_RDI + 0xb) + 0x2a) = uVar3;
  uVar3 = std::optional<unsigned_int>::value_or<int>
                    ((optional<unsigned_int> *)in_stack_fffffffffffffea8,
                     (int *)in_stack_fffffffffffffea0);
  *(uint *)((long)(in_RDI + 0xb) + 0x2e) = uVar3;
  uVar4 = 1;
  if (((*in_RDI)[0x49] & 1U) != 0) {
    uVar4 = 6;
  }
  *(undefined4 *)((long)(in_RDI + 0xb) + 0x32) = uVar4;
  uVar3 = std::optional<unsigned_int>::value_or<unsigned_int>
                    ((optional<unsigned_int> *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  *(uint *)((long)(in_RDI + 0xb) + 0x36) = uVar3;
  if ((*(char *)((long)(in_RDI + 2) + 0x14) & 1U) != 0) {
    checkNumInputImages(in_stack_ffffffffffffff98);
  }
  bVar2 = isFormatAstc(*(VkFormat *)(*in_RDI + 0x4c));
  if (bVar2) {
    fillOptionsCodecAstc<ktx::Combine<ktx::OptionsCreate,ktx::OptionsEncodeASTC,ktx::OptionsEncodeBasis<false>,ktx::OptionsEncodeCommon,ktx::OptionsMetrics,ktx::OptionsDeflate,ktx::OptionsMultiInSingleOut,ktx::OptionsGeneric>>
              ((Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
                *)0x1dbfad);
    if ((*(byte *)((long)(in_RDI + 10) + 4) & 1) != 0) {
      Reporter::fatal_usage<char_const(&)[37],char_const*&>
                (in_stack_ffffffffffffff18,(char (*) [37])in_RDI,(char **)in_stack_ffffffffffffff08)
      ;
    }
  }
  else {
    for (local_38 = OptionsEncodeASTC::kAstcOptions;
        local_38 != (char **)&OptionsEncodeASTC::kAstcOptions;
        local_38 = (char **)((long)local_38 + 8)) {
      in_stack_ffffffffffffff00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_38;
      in_stack_ffffffffffffff08 = (Reporter *)&local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,(allocator<char> *)in_stack_fffffffffffffed0);
      this_00 = cxxopts::ParseResult::operator[]
                          (in_stack_fffffffffffffed0,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffecf,
                                    CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
      sVar5 = cxxopts::OptionValue::count(this_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::allocator<char>::~allocator(&local_69);
      if (sVar5 != 0) {
        Reporter::fatal_usage<char_const(&)[41],char_const*&>
                  (in_stack_ffffffffffffff18,(char (*) [41])in_RDI,
                   (char **)in_stack_ffffffffffffff08);
      }
    }
  }
  if (*(int *)((long)(in_RDI + 9) + 0x2a) == 1) {
    bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x1dc000);
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[54]>
                (in_stack_ffffffffffffff08,(char (*) [54])in_stack_ffffffffffffff00);
    }
    bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x1dc034);
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[54]>
                (in_stack_ffffffffffffff08,(char (*) [54])in_stack_ffffffffffffff00);
    }
  }
  if (((((*(int *)((long)(in_RDI + 9) + 0x2a) != 0) &&
        (iVar1 = *(int *)(*in_RDI + 0x4c), iVar1 != 9)) && (1 < iVar1 - 0xfU)) &&
      ((1 < iVar1 - 0x16U && (iVar1 != 0x1d)))) && ((iVar1 != 0x25 && (iVar1 != 0x2b)))) {
    toString_abi_cxx11_(in_stack_ffffffffffffff24);
    Reporter::fatal_usage<char_const(&)[86],std::__cxx11::string>
              (in_stack_ffffffffffffff18,in_RDI,&in_stack_ffffffffffffff08->commandName);
    std::__cxx11::string::~string(local_a0);
  }
  local_a1 = true;
  if (*(int *)((long)(in_RDI + 9) + 0x2a) != 1) {
    local_a1 = *(int *)((long)(in_RDI + 9) + 0x2a) == 2;
  }
  local_a2 = isFormatAstc(*(VkFormat *)(*in_RDI + 0x4c));
  local_a3 = true;
  if ((local_a1 & 1) == 0) {
    local_a3 = local_a2;
  }
  if ((local_a1 & 1) != 0) {
    fillOptionsCodecBasis<ktx::Combine<ktx::OptionsCreate,ktx::OptionsEncodeASTC,ktx::OptionsEncodeBasis<false>,ktx::OptionsEncodeCommon,ktx::OptionsMetrics,ktx::OptionsDeflate,ktx::OptionsMultiInSingleOut,ktx::OptionsGeneric>>
              ((Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
                *)0x1dc1b5);
  }
  if (((*(byte *)((long)(in_RDI + 10) + 5) & 1) != 0) && ((local_a3 & 1) == 0)) {
    Reporter::fatal_usage<char_const(&)[70]>
              (in_stack_ffffffffffffff08,(char (*) [70])in_stack_ffffffffffffff00);
  }
  if (((*(byte *)((long)(in_RDI + 10) + 6) & 1) != 0) && ((local_a3 & 1) == 0)) {
    Reporter::fatal_usage<char_const(&)[70]>
              (in_stack_ffffffffffffff08,(char (*) [70])in_stack_ffffffffffffff00);
  }
  bVar2 = isFormatAstc(*(VkFormat *)(*in_RDI + 0x4c));
  if ((bVar2) && ((*(char *)((long)(in_RDI + 2) + 0x14) & 1U) == 0)) {
    *(undefined1 *)((long)(in_RDI + 6) + 0x14) = 1;
    switch(*(undefined4 *)(*in_RDI + 0x4c)) {
    case 0x9d:
    case 0x9e:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 0;
      break;
    case 0x9f:
    case 0xa0:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 1;
      break;
    case 0xa1:
    case 0xa2:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 2;
      break;
    case 0xa3:
    case 0xa4:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 3;
      break;
    case 0xa5:
    case 0xa6:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 4;
      break;
    case 0xa7:
    case 0xa8:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 5;
      break;
    case 0xa9:
    case 0xaa:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 6;
      break;
    case 0xab:
    case 0xac:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 9;
      break;
    case 0xad:
    case 0xae:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 7;
      break;
    case 0xaf:
    case 0xb0:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 8;
      break;
    case 0xb1:
    case 0xb2:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 10;
      break;
    case 0xb3:
    case 0xb4:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 0xb;
      break;
    case 0xb5:
    case 0xb6:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 0xc;
      break;
    case 0xb7:
    case 0xb8:
      *(undefined4 *)((long)(in_RDI + 5) + 0x3a) = 1;
      *(undefined4 *)((long)(in_RDI + 5) + 0x36) = 0xd;
      break;
    default:
      toString_abi_cxx11_(in_stack_ffffffffffffff24);
      Reporter::fatal<char_const(&)[37],std::__cxx11::string>
                (in_stack_ffffffffffffff18,(ReturnCode)((ulong)in_RDI >> 0x20),
                 (char (*) [37])in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_c8);
    }
  }
  if ((((*in_RDI)[0x48] & 1U) != 0) && ((*(byte *)((long)(in_RDI + 6) + 0x14) & 1) != 0)) {
    toString_abi_cxx11_(in_stack_ffffffffffffff24);
    Reporter::fatal_usage<char_const(&)[78],std::__cxx11::string>
              (in_stack_ffffffffffffff18,(char (*) [78])in_RDI,
               &in_stack_ffffffffffffff08->commandName);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  }
  return;
}

Assistant:

void CommandCreate::processOptions(cxxopts::Options& opts, cxxopts::ParseResult& args) {
    options.process(opts, args, *this);

    numLevels = options.levels.value_or(1);
    numLayers = options.layers.value_or(1);
    numFaces = options.cubemap ? 6 : 1;
    baseDepth = options.depth.value_or(1u);

    if (options.raw) {
        // options.levels <= max for dimensions was checked in CreateOptions::process
        checkNumInputImages();
    }

    if (!isFormatAstc(options.vkFormat)) {
        for (const char* astcOption : OptionsEncodeASTC::kAstcOptions)
            if (args[astcOption].count())
                fatal_usage("--{} can only be used with ASTC formats.", astcOption);
    } else {
        fillOptionsCodecAstc<decltype(options)>(options);
        if (options.OptionsEncodeCommon::noSSE)
            fatal_usage("--{} is not allowed with ASTC encode", OptionsEncodeCommon::kNoSse);
    }

    if (options.codec == BasisCodec::BasisLZ) {
        if (options.zstd.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with Zstd.");

        if (options.zlib.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with ZLIB.");
    }

    if (options.codec != BasisCodec::NONE) {
        switch (options.vkFormat) {
        case VK_FORMAT_R8_UNORM:
        case VK_FORMAT_R8_SRGB:
        case VK_FORMAT_R8G8_UNORM:
        case VK_FORMAT_R8G8_SRGB:
        case VK_FORMAT_R8G8B8_UNORM:
        case VK_FORMAT_R8G8B8_SRGB:
        case VK_FORMAT_R8G8B8A8_UNORM:
        case VK_FORMAT_R8G8B8A8_SRGB:
            // Allowed formats
            break;
        default:
            fatal_usage("Only R8, RG8, RGB8, or RGBA8 UNORM and SRGB formats can be encoded, "
                "but format is {}.", toString(VkFormat(options.vkFormat)));
            break;
        }
    }

    const auto basisCodec = options.codec == BasisCodec::BasisLZ || options.codec == BasisCodec::UASTC;
    const auto astcCodec = isFormatAstc(options.vkFormat);
    const auto canCompare = basisCodec || astcCodec;

    if (basisCodec)
        fillOptionsCodecBasis<decltype(options)>(options);

    if (options.compare_ssim && !canCompare)
        fatal_usage("--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    if (options.compare_psnr && !canCompare)
        fatal_usage("--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");

    if (isFormatAstc(options.vkFormat) && !options.raw) {
        options.encodeASTC = true;

        switch (options.vkFormat) {
        case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_4x4;
            break;
        case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x4;
            break;
        case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x5;
            break;
        case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x5;
            break;
        case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x6;
            break;
        case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x5;
            break;
        case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x6;
            break;
        case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x8;
            break;
        case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x5;
            break;
        case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x6;
            break;
        case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x8;
            break;
        case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x10;
            break;
        case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x10;
            break;
        case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x12;
            break;
        default:
            fatal(rc::NOT_SUPPORTED, "{} is unsupported for ASTC encoding.", toString(options.vkFormat));
            break;
        }
    }

    if (options._1d && options.encodeASTC)
        fatal_usage("ASTC format {} cannot be used for 1 dimensional textures (indicated by --1d).",
                toString(options.vkFormat));

}